

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O1

void Abc_SuppGenFilter(Vec_Wrd_t *p,int nBits)

{
  uint uVar1;
  word *pwVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = p->nSize;
  if ((long)(int)uVar1 < 1) {
    uVar4 = 0;
  }
  else {
    pwVar2 = p->pArray;
    lVar5 = 0;
    uVar4 = 0;
    do {
      uVar3 = pwVar2[lVar5];
      if ((uVar3 & 1L << ((byte)nBits & 0x3f)) == 0) {
        if (uVar1 <= uVar4) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                        ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
        }
        uVar6 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        pwVar2[uVar6] = uVar3;
      }
      lVar5 = lVar5 + 1;
    } while ((int)uVar1 != lVar5);
  }
  if ((int)uVar1 < (int)uVar4) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                  ,0x255,"void Vec_WrdShrink(Vec_Wrd_t *, int)");
  }
  p->nSize = uVar4;
  return;
}

Assistant:

void Abc_SuppGenFilter( Vec_Wrd_t * p, int nBits )
{
    word Ent;
    int i, k = 0;
    Vec_WrdForEachEntry( p, Ent, i )
        if ( ((Ent >> nBits) & 1) == 0 )
            Vec_WrdWriteEntry( p, k++, Ent );
    Vec_WrdShrink( p, k );
}